

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::emulate_mthd(MthdEmuD3D56TlvUv *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset != 0x10) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [this->which_vtx * 4 + 0xd] = 0;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [this->which_vtx * 4 + 0xe] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [this->which_vtx * 4 + 0xf] = 0x3f800000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [(long)(this->which_vtx * 4 + 0xc) + (long)this->which_uv] =
         (this->super_SingleMthdTest).super_MthdTest.val;
  }
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.cls;
  uVar5 = *(uint *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  bVar3 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc24[2] & 0xf;
  if (uVar4 != 0x48) {
    bVar3 = (byte)uVar5;
  }
  if (this->which_vtx == 0 || this->which_uv == 0) {
    puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
    *puVar1 = *puVar1 | (uint)(1L << ((char)this->which_uv + (char)this->which_vtx * '\x02' + 6U &
                                     0x3f));
  }
  if (this->fin == true) {
    state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
    uVar7 = 0x7f;
    if ((uVar4 - 0x55 & 0xffffffbf) == 0) {
      uVar7 = 0x1ff;
    }
    uVar6 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0];
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1];
    if ((uVar7 & ~uVar2) == 0) {
      uVar6 = (uint)(1L << (bVar3 & 0x3f)) | uVar6;
      uVar5 = (uVar5 & 0xf) << 0x10 | uVar6 & 0xfff0ffff;
      if (uVar4 == 0x48) {
        uVar5 = uVar6;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] = uVar5;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] = uVar2 & ~uVar7;
    }
    else if (-1 < (long)((ulong)uVar6 << (~((byte)(uVar6 >> 0x10) & 0xf) & 0x3f))) {
      nv04_pgraph_blowup(state,0x4000);
      uVar4 = (this->super_SingleMthdTest).super_MthdTest.cls;
    }
    if (uVar4 == 0x48) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
    }
    if ((((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format & 0xf00) == 0)
       && (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x400000) != 0
          )) {
      nv04_pgraph_blowup(state,0x200);
      return;
    }
  }
  else {
    puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
    *puVar1 = *puVar1 & ~(uint)(1L << (bVar3 & 0x3f));
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			if (chipset.chipset != 0x10)
				exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 1] = 0;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 2] = 0;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 3] = 0x3f800000;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + which_uv] = val;
		}
		int vidx = (cls == 0x48 ? extr(exp.misc24[2], 0, 4) : idx);
		if (!which_uv || !which_vtx)
			insrt(exp.valid[1], 6 + which_vtx * 2 + which_uv, 1, 1);
		if (fin) {
			// XXX: test this thing
			skip = true;
			uint32_t msk = (cls == 0x55 || cls == 0x95 ? 0x1ff : 0x7f);
			int ovidx = extr(exp.valid[0], 16, 4);
			if ((exp.valid[1] & msk) == msk) {
				insrt(exp.valid[0], vidx, 1, 1);
				if (cls != 0x48)
					insrt(exp.valid[0], 16, 4, vidx);
				exp.valid[1] &= ~msk;
			} else if (!extr(exp.valid[0], ovidx, 1)) {
				nv04_pgraph_blowup(&exp, 0x4000);
			}
			// sounds buggy...
			if (extr(exp.debug_d, 5, 1) && cls != 0x48)
				vidx = extr(exp.valid[0], 16, 4);
			if (cls == 0x55) {
				vidx &= 7;
				// ...
			} else {
				// ...
			}
			if (cls == 0x48) {
				// XXX
				skip = true;
			}
			if (!extr(exp.surf_format, 8, 4) && extr(exp.debug_d, 22, 1))
				nv04_pgraph_blowup(&exp, 0x0200);
		} else {
			insrt(exp.valid[0], vidx, 1, 0);
		}
	}